

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  u32 uVar2;
  u8 *puVar3;
  bool bVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  u16 uVar11;
  int iVar12;
  undefined6 in_register_00000012;
  ushort uVar13;
  ulong uVar14;
  undefined6 in_register_00000032;
  ulong uVar15;
  uint uVar16;
  byte bVar17;
  ulong uVar18;
  
  uVar14 = CONCAT62(in_register_00000032,iStart) & 0xffffffff;
  iVar12 = (int)CONCAT62(in_register_00000012,iSize);
  puVar3 = pPage->aData;
  uVar2 = pPage->pBt->usableSize;
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar3 + iStart,0,(ulong)iSize);
  }
  uVar16 = (uint)CONCAT62(in_register_00000032,iStart);
  uVar7 = iVar12 + uVar16;
  uVar15 = (ulong)pPage->hdrOffset;
  uVar1 = uVar15 + 1;
  if ((puVar3[uVar15 + 2] == '\0') && (puVar3[uVar1] == '\0')) {
    uVar13 = 0;
    uVar18 = uVar1;
    uVar11 = iSize;
LAB_0021bffb:
    uVar5 = uVar14 & 0xffff;
    if ((uint)(ushort)(*(ushort *)(puVar3 + uVar15 + 5) << 8 | *(ushort *)(puVar3 + uVar15 + 5) >> 8
                      ) == (uint)uVar5) {
      if ((uint)uVar1 != (uint)uVar18) {
        uVar10 = 0xef51;
        goto LAB_0021be27;
      }
      *(ushort *)(puVar3 + uVar1) = uVar13 << 8 | uVar13 >> 8;
      puVar3[uVar15 + 5] = (u8)(uVar7 >> 8);
      puVar3[uVar15 + 6] = (u8)uVar7;
    }
    else {
      *(ushort *)(puVar3 + uVar18) = (ushort)uVar14 << 8 | (ushort)uVar14 >> 8;
      puVar3[uVar5] = (u8)(uVar13 >> 8);
      puVar3[uVar5 + 1] = (u8)uVar13;
      puVar3[uVar5 + 2] = (u8)(uVar11 >> 8);
      puVar3[uVar5 + 3] = (u8)uVar11;
    }
    pPage->nFree = pPage->nFree + iSize;
    iVar12 = 0;
  }
  else {
    uVar5 = uVar1;
    do {
      uVar18 = uVar5;
      uVar6 = *(ushort *)(puVar3 + uVar18);
      uVar13 = uVar6 << 8 | uVar6 >> 8;
      uVar5 = (ulong)uVar13;
      uVar8 = (uint)uVar13;
      uVar9 = (uint)uVar18;
      if ((ushort)uVar14 <= uVar13) goto LAB_0021bdfd;
    } while (uVar9 + 4 <= uVar8);
    if (uVar13 == 0) {
LAB_0021bdfd:
      if (uVar2 - 4 < uVar8) {
        uVar10 = 0xef29;
      }
      else if (uVar7 + 3 < uVar8 || uVar13 == 0) {
        bVar17 = 0;
LAB_0021be6e:
        uVar11 = (u16)iVar12;
        if ((uint)uVar1 < uVar9) {
          uVar6 = *(ushort *)(puVar3 + uVar18 + 2) << 8 | *(ushort *)(puVar3 + uVar18 + 2) >> 8;
          bVar4 = true;
          if (uVar16 <= uVar6 + uVar9 + 3) {
            uVar9 = uVar6 + uVar9;
            if (uVar16 < uVar9) {
              bVar4 = false;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xef44,
                          "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
            }
            else {
              bVar17 = bVar17 + ((char)iStart - (char)uVar9);
              uVar11 = (short)uVar7 - (short)uVar18;
              uVar14 = uVar18;
            }
          }
          if (!bVar4) {
            return 0xb;
          }
        }
        if (bVar17 <= puVar3[uVar15 + 7]) {
          puVar3[uVar15 + 7] = puVar3[uVar15 + 7] - bVar17;
          goto LAB_0021bffb;
        }
        uVar10 = 0xef4a;
      }
      else {
        bVar17 = (char)(uVar6 >> 8) - (char)uVar7;
        if (uVar13 < uVar7) {
          uVar10 = 0xef34;
        }
        else {
          uVar7 = (ushort)(*(ushort *)(puVar3 + uVar5 + 2) << 8 |
                          *(ushort *)(puVar3 + uVar5 + 2) >> 8) + uVar8;
          if (uVar7 <= pPage->pBt->usableSize) {
            iVar12 = uVar7 - uVar16;
            uVar13 = *(ushort *)(puVar3 + uVar5) << 8 | *(ushort *)(puVar3 + uVar5) >> 8;
            goto LAB_0021be6e;
          }
          uVar10 = 0xef37;
        }
      }
    }
    else {
      uVar10 = 0xef25;
    }
LAB_0021be27:
    iVar12 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
                "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
  }
  return iVar12;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u32 iLast = pPage->pBt->usableSize-4; /* Largest possible freeblock offset */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=iLast );

  /* Overwrite deleted information with zeros when the secure_delete
  ** option is enabled */
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    memset(&data[iStart], 0, iSize);
  }

  /* The list of freeblocks must be in ascending order.  Find the 
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<iPtr+4 ){
        if( iFreeBlk==0 ) break;
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>iLast ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
    assert( iFreeBlk>iPtr || iFreeBlk==0 );
  
    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }
  
    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
    data[hdr+7] -= nFrag;
  }
  if( iStart==get2byte(&data[hdr+5]) ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
    put2byte(&data[iStart], iFreeBlk);
    put2byte(&data[iStart+2], iSize);
  }
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}